

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O3

void __thiscall
QGraphicsDropShadowEffect::setOffset(QGraphicsDropShadowEffect *this,QPointF *offset)

{
  long lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  long in_FS_OFFSET;
  QPointF local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  local_38 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8));
  bVar3 = qFuzzyCompare(&local_38,offset);
  if (!bVar3) {
    QPixmapDropShadowFilter::setOffset(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8),offset);
    QGraphicsEffect::updateBoundingRect(&this->super_QGraphicsEffect);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = offset;
    local_38 = (QPointF)(auVar2 << 0x40);
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsDropShadowEffect::setOffset(const QPointF &offset)
{
    Q_D(QGraphicsDropShadowEffect);
    if (d->filter->offset() == offset)
        return;

    d->filter->setOffset(offset);
    updateBoundingRect();
    emit offsetChanged(offset);
}